

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O3

void __thiscall
slang::syntax::SimplePathSuffixSyntax::setChild
          (SimplePathSuffixSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar2;
  SeparatedSyntaxList<slang::syntax::NameSyntax> *pSVar3;
  logic_error *this_00;
  long *plVar4;
  size_type *psVar5;
  long *plVar6;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (index == 0) {
    ppSVar2 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child
                        );
    pSVar3 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::NameSyntax>>(*ppSVar2)
    ;
    (this->outputs).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar3->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->outputs).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar3->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->outputs).super_SyntaxListBase.childCount = (pSVar3->super_SyntaxListBase).childCount;
    sVar1 = (pSVar3->elements).size_;
    (this->outputs).elements.data_ = (pSVar3->elements).data_;
    (this->outputs).elements.size_ = sVar1;
    return;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  local_d0[0] = local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_d0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O3/extern/slang/source/AllSyntax.cpp"
             ,"");
  plVar4 = (long *)std::__cxx11::string::append((char *)local_d0);
  local_b0._M_dataplus._M_p = (pointer)*plVar4;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar5) {
    local_b0.field_2._M_allocated_capacity = *psVar5;
    local_b0.field_2._8_8_ = plVar4[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar5;
  }
  local_b0._M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::to_string(&local_70,0x2e32);
  std::operator+(&local_50,&local_b0,&local_70);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_90 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_90 == plVar6) {
    local_80 = *plVar6;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar6;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_90);
  local_f0 = (long *)*plVar4;
  plVar6 = plVar4 + 2;
  if (local_f0 == plVar6) {
    local_e0 = *plVar6;
    lStack_d8 = plVar4[3];
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *plVar6;
  }
  local_e8 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::logic_error::logic_error(this_00,(string *)&local_f0);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

void SimplePathSuffixSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: outputs = child.node()->as<SeparatedSyntaxList<NameSyntax>>(); return;
        default: ASSUME_UNREACHABLE;
    }
}